

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ScissorBoxTestCase::test(ScissorBoxTestCase *this)

{
  uint uVar1;
  StateVerifier *pSVar2;
  TestContext *pTVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  RenderTarget *pRVar6;
  uint y;
  int iVar7;
  Random rnd;
  deRandom local_40;
  
  deRandom_init(&local_40,0xabcdef);
  pSVar2 = this->m_verifier;
  pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar6 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar1 = pRVar6->m_width;
  pRVar6 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  (*pSVar2->_vptr_StateVerifier[3])(pSVar2,pTVar3,0xc10,0,0,(ulong)uVar1,pRVar6->m_height);
  ApiCase::expectError(&this->super_ApiCase,0);
  iVar7 = 0x78;
  do {
    dVar4 = deRandom_getUint32(&local_40);
    uVar1 = dVar4 % 0x1f401 - 64000;
    dVar4 = deRandom_getUint32(&local_40);
    y = dVar4 % 0x1f401 - 64000;
    dVar4 = deRandom_getUint32(&local_40);
    dVar5 = deRandom_getUint32(&local_40);
    glu::CallLogWrapper::glScissor
              (&(this->super_ApiCase).super_CallLogWrapper,uVar1,y,dVar4 % 0xfa01,dVar5 % 0xfa01);
    (*this->m_verifier->_vptr_StateVerifier[3])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xc10,
               (ulong)uVar1,(ulong)y,(ulong)(dVar4 % 0xfa01),dVar5 % 0xfa01);
    ApiCase::expectError(&this->super_ApiCase,0);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		// verify initial value
		m_verifier->verifyInteger4(m_testCtx, GL_SCISSOR_BOX, 0, 0, m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			GLint left		= rnd.getInt(-64000, 64000);
			GLint bottom	= rnd.getInt(-64000, 64000);
			GLsizei width	= rnd.getInt(0, 64000);
			GLsizei height	= rnd.getInt(0, 64000);

			glScissor(left, bottom, width, height);
			m_verifier->verifyInteger4(m_testCtx, GL_SCISSOR_BOX, left, bottom, width, height);
			expectError(GL_NO_ERROR);
		}
	}